

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

bool anon_unknown.dwarf_1f65f7::checkPixels<float>
               (Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,int lx,int rx,int ly,int ry,
               int width)

{
  long lVar1;
  float fVar2;
  bool bVar3;
  ulong uVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  float fVar12;
  bool local_73;
  
  local_73 = ry < ly;
  if (ly <= ry) {
    lVar8 = (long)ly;
    do {
      if (lx <= rx) {
        lVar7 = (long)lx;
        bVar3 = rx < lx;
        do {
          uVar4 = (ulong)sampleCount->_data[sampleCount->_sizeY * lVar8 + lVar7];
          bVar11 = uVar4 != 0;
          if (bVar11) {
            iVar9 = ((int)lVar8 * width + (int)lVar7) % 0x801;
            fVar12 = (float)iVar9;
            fVar2 = *ph->_data[ph->_sizeY * lVar8 + lVar7];
            if ((fVar2 != fVar12) || (NAN(fVar2) || NAN(fVar12))) {
              uVar10 = 0;
            }
            else {
              uVar10 = 0;
              do {
                if (uVar4 - 1 == uVar10) goto LAB_00182337;
                fVar2 = ph->_data[ph->_sizeY * lVar8 + lVar7][uVar10 + 1];
                uVar10 = uVar10 + 1;
              } while ((fVar2 == fVar12) && (!NAN(fVar2) && !NAN(fVar12)));
              bVar11 = uVar10 < uVar4;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", sample ",9);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
            poVar5 = std::ostream::_M_insert<double>
                               ((double)ph->_data[ph->_sizeY * lVar8 + lVar7][uVar10]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", should be ",0xc);
            plVar6 = (long *)std::ostream::operator<<(poVar5,iVar9);
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            std::ostream::flush();
            if (bVar11) {
              if (!bVar3) {
                return local_73;
              }
              break;
            }
          }
LAB_00182337:
          lVar1 = lVar7 + 1;
          bVar3 = rx <= lVar7;
          lVar7 = lVar1;
        } while (rx + 1 != (int)lVar1);
      }
      lVar7 = lVar8 + 1;
      local_73 = ry <= lVar8;
      lVar8 = lVar7;
    } while (ry + 1 != (int)lVar7);
  }
  return local_73;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount,
    Array2D<T*>&           ph,
    int                    lx,
    int                    rx,
    int                    ly,
    int                    ry,
    int                    width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T> (((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i
                         << ": " << ph[y][x][i] << ", should be "
                         << (y * width + x) % 2049 << endl
                         << flush;
                    return false;
                }
            }
        }
    return true;
}